

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

bool __thiscall soul::AST::TypeMetaFunction::isSizeOfUnsizedType(TypeMetaFunction *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Type local_28;
  
  if (this->operation == size) {
    iVar2 = (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((char)iVar2 != '\0') {
      getSourceType(&local_28,this);
      bVar3 = local_28.boundingSize == 0 && local_28.category == array;
      bVar1 = true;
      goto LAB_001fa0f3;
    }
  }
  bVar1 = false;
  bVar3 = false;
LAB_001fa0f3:
  if (bVar1) {
    RefCountedPtr<soul::Structure>::decIfNotNull(local_28.structure.object);
  }
  return bVar3;
}

Assistant:

bool isSizeOfUnsizedType() const
        {
            return operation == Op::size && source->isResolved() && getSourceType().isUnsizedArray();
        }